

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O2

DisplayAction * setLineWidth(DisplayAction *__return_storage_ptr__,int width)

{
  offset_in_Display_to_subr in_R9;
  allocator<char> local_59;
  code *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_59);
  local_58 = Display::setLineWidth;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  DisplayAction::DisplayAction(__return_storage_ptr__,width,&local_38,0,0,in_R9);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

DisplayAction setLineWidth( const int width )
{
    return DisplayAction(width, "", 0, &Display::setLineWidth, 0);
}